

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

void __thiscall phosg::Poll::add(Poll *this,int fd,short events)

{
  bool bVar1;
  pointer ppVar2;
  bool bVar3;
  const_iterator local_50;
  __normal_iterator<pollfd_*,_std::vector<pollfd,_std::allocator<pollfd>_>_> local_48 [2];
  pollfd *local_38;
  pollfd *local_30;
  __normal_iterator<pollfd_*,_std::vector<pollfd,_std::allocator<pollfd>_>_> local_28;
  __normal_iterator<pollfd_*,_std::vector<pollfd,_std::allocator<pollfd>_>_> insert_it;
  pollfd pfd;
  anon_class_1_0_00000001_for__M_comp pred;
  short events_local;
  int fd_local;
  Poll *this_local;
  
  insert_it._M_current._0_4_ = fd;
  insert_it._M_current._4_2_ = events;
  local_30 = (pollfd *)
             std::vector<pollfd,_std::allocator<pollfd>_>::begin
                       ((vector<pollfd,_std::allocator<pollfd>_> *)this);
  local_38 = (pollfd *)
             std::vector<pollfd,_std::allocator<pollfd>_>::end
                       ((vector<pollfd,_std::allocator<pollfd>_> *)this);
  local_28 = ::std::
             upper_bound<__gnu_cxx::__normal_iterator<pollfd*,std::vector<pollfd,std::allocator<pollfd>>>,pollfd,phosg::Poll::add(int,short)::__0>
                       (local_30,local_38,&insert_it);
  local_48[0]._M_current =
       (pollfd *)
       std::vector<pollfd,_std::allocator<pollfd>_>::end
                 ((vector<pollfd,_std::allocator<pollfd>_> *)this);
  bVar1 = __gnu_cxx::operator==<pollfd_*,_std::vector<pollfd,_std::allocator<pollfd>_>_>
                    (&local_28,local_48);
  bVar3 = false;
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    ppVar2 = __gnu_cxx::__normal_iterator<pollfd_*,_std::vector<pollfd,_std::allocator<pollfd>_>_>::
             operator->(&local_28);
    bVar3 = ppVar2->fd == fd;
  }
  if (bVar3) {
    ppVar2 = __gnu_cxx::__normal_iterator<pollfd_*,_std::vector<pollfd,_std::allocator<pollfd>_>_>::
             operator->(&local_28);
    ppVar2->events = events;
  }
  else {
    __gnu_cxx::__normal_iterator<pollfd_const*,std::vector<pollfd,std::allocator<pollfd>>>::
    __normal_iterator<pollfd*>
              ((__normal_iterator<pollfd_const*,std::vector<pollfd,std::allocator<pollfd>>> *)
               &local_50,&local_28);
    std::vector<pollfd,_std::allocator<pollfd>_>::insert
              ((vector<pollfd,_std::allocator<pollfd>_> *)this,local_50,(value_type *)&insert_it);
  }
  return;
}

Assistant:

void Poll::add(int fd, short events) {
  auto pred = [](const struct pollfd& x, const struct pollfd& y) {
    return x.fd < y.fd;
  };

  struct pollfd pfd;
  pfd.fd = fd;
  pfd.events = events;
  auto insert_it = upper_bound(this->poll_fds.begin(), this->poll_fds.end(),
      pfd, pred);
  if (insert_it != this->poll_fds.end() && insert_it->fd == fd) {
    insert_it->events = events;
  } else {
    this->poll_fds.insert(insert_it, pfd);
  }
}